

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O2

long bhf::ads::AddRemoteRoute
               (string *remote,AmsNetId destNetId,string *destAddr,string *routeName,
               string *remoteUsername,string *remotePassword)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  ostream *poVar10;
  uint32_t serviceId;
  int iVar11;
  AmsNetId destNetId_local;
  Frame f;
  string local_1e0;
  AmsAddr myAddr;
  stringstream stream;
  ostream local_1a8 [376];
  
  destNetId_local.b._0_4_ = destNetId.b._0_4_;
  destNetId_local.b._4_2_ = destNetId.b._4_2_;
  Frame::Frame(&f,0x100,(void *)0x0);
  bVar1 = PrependUdpTag(&f,destAddr,5);
  bVar2 = PrependUdpTag(&f,remotePassword,2);
  bVar3 = PrependUdpTag(&f,remoteUsername,0xd);
  Frame::prepend(&f,&destNetId_local,6);
  PrependUdpLenTagId(&f,6,7);
  if (routeName->_M_string_length != 0) {
    destAddr = routeName;
  }
  bVar4 = PrependUdpTag(&f,destAddr,0xc);
  serviceId = (uint32_t)bVar2;
  _stream = (uint)bVar4 + (uint)bVar1 + (uint)bVar2 + (uint)bVar3 + 1;
  Frame::prepend<unsigned_int>(&f,(uint *)&stream);
  myAddr.netId.b[4] = destNetId_local.b[4];
  myAddr.netId.b[5] = destNetId_local.b[5];
  myAddr.netId.b[0] = destNetId_local.b[0];
  myAddr.netId.b[1] = destNetId_local.b[1];
  myAddr.netId.b[2] = destNetId_local.b[2];
  myAddr.netId.b[3] = destNetId_local.b[3];
  myAddr.port = 0;
  Frame::prepend(&f,&myAddr,8);
  uVar8 = SendRecv((ads *)remote,(string *)&f,(Frame *)0x6,serviceId);
  if (uVar8 == 0) {
    sVar9 = Frame::capacity(&f);
    if (sVar9 < 0xc) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      poVar10 = std::operator<<(local_1a8,"AddRemoteRoute");
      poVar10 = std::operator<<(poVar10,"(): frame too short to be AMS response \'0x");
      *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
           *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 8;
      Frame::capacity(&f);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::operator<<(poVar10,"\'\n");
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_1e0);
LAB_00123f80:
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      uVar8 = 0x705;
    }
    else {
      Frame::remove(&f,(char *)0x8);
      uVar7 = Frame::pop<unsigned_int>(&f);
      iVar11 = uVar7 + 1;
      while (iVar11 = iVar11 + -1, iVar11 != 0) {
        sVar9 = Frame::capacity(&f);
        if (sVar9 < 4) {
          std::__cxx11::stringstream::stringstream((stringstream *)&stream);
          poVar10 = std::operator<<(local_1a8,"AddRemoteRoute");
          poVar10 = std::operator<<(poVar10,"(): frame too short to be AMS response \'0x");
          *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
               *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 8;
          Frame::capacity(&f);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::operator<<(poVar10,"\'\n");
          std::__cxx11::stringbuf::str();
          Logger::Log(3,&local_1e0);
          goto LAB_00123f80;
        }
        uVar5 = Frame::pop<unsigned_short>(&f);
        uVar6 = Frame::pop<unsigned_short>(&f);
        if (uVar5 == 1) {
          if (uVar6 == 4) {
            uVar7 = Frame::pop<unsigned_int>(&f);
            uVar8 = (ulong)uVar7;
            goto LAB_00123f99;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)&stream);
          poVar10 = std::operator<<(local_1a8,"AddRemoteRoute");
          poVar10 = std::operator<<(poVar10,"(): response contains invalid tag length \'");
          *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
               *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar6);
          std::operator<<(poVar10,"\'\n");
          std::__cxx11::stringbuf::str();
          Logger::Log(3,&local_1e0);
          goto LAB_00123f80;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar10 = std::operator<<(local_1a8,"AddRemoteRoute");
        poVar10 = std::operator<<(poVar10,"(): response contains tagId \'0x");
        *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
             *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar5);
        std::operator<<(poVar10,"\' -> ignoring\n");
        std::__cxx11::stringbuf::str();
        Logger::Log(2,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
        Frame::remove(&f,(char *)(ulong)uVar6);
      }
      uVar8 = 0x706;
    }
  }
LAB_00123f99:
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&f.m_Data);
  return uVar8;
}

Assistant:

long AddRemoteRoute(const std::string& remote,
                    AmsNetId           destNetId,
                    const std::string& destAddr,
                    const std::string& routeName,
                    const std::string& remoteUsername,
                    const std::string& remotePassword)
{
    Frame f { 256 };
    uint32_t tagCount = 0;
    tagCount += PrependUdpTag(f, destAddr, UdpTag::COMPUTERNAME);
    tagCount += PrependUdpTag(f, remotePassword, UdpTag::PASSWORD);
    tagCount += PrependUdpTag(f, remoteUsername, UdpTag::USERNAME);
    tagCount += PrependUdpTag(f, destNetId, UdpTag::NETID);
    tagCount += PrependUdpTag(f, routeName.empty() ? destAddr : routeName, UdpTag::ROUTENAME);
    f.prepend(htole(tagCount));

    const auto myAddr = AmsAddr { destNetId, 0 };
    f.prepend(&myAddr, sizeof(myAddr));

    const auto status = SendRecv(remote, f, UdpServiceId::ADDROUTE);
    if (status) {
        return status;
    }

    // We expect at least the AmsAddr and count fields
    if (sizeof(AmsAddr) + sizeof(uint32_t) > f.capacity()) {
        LOG_ERROR(__FUNCTION__ << "(): frame too short to be AMS response '0x" << std::hex << f.capacity() << "'\n");
        return ADSERR_DEVICE_INVALIDSIZE;
    }

    // ignore AmsAddr in response
    f.remove(sizeof(AmsAddr));

    // process UDP discovery tags
    auto count = f.pop_letoh<uint32_t>();
    while (count--) {
        uint16_t tag;
        uint16_t len;
        if (sizeof(tag) + sizeof(len) > f.capacity()) {
            LOG_ERROR(__FUNCTION__ << "(): frame too short to be AMS response '0x" << std::hex << f.capacity() <<
                      "'\n");
            return ADSERR_DEVICE_INVALIDSIZE;
        }

        tag = f.pop_letoh<uint16_t>();
        len = f.pop_letoh<uint16_t>();
        if (1 != tag) {
            LOG_WARN(__FUNCTION__ << "(): response contains tagId '0x" << std::hex << tag << "' -> ignoring\n");
            f.remove(len);
            continue;
        }
        if (sizeof(uint32_t) != len) {
            LOG_ERROR(__FUNCTION__ << "(): response contains invalid tag length '" << std::hex << len << "'\n");
            return ADSERR_DEVICE_INVALIDSIZE;
        }
        return f.pop_letoh<uint32_t>();
    }
    return ADSERR_DEVICE_INVALIDDATA;
}